

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_0::DatagramPortImpl::send
          (DatagramPortImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _func_int **pp_Var1;
  SourceLocation location;
  undefined8 uVar2;
  DatagramPort DVar3;
  int osErrorNumber;
  SocketAddress *pSVar4;
  FixVoid<unsigned_long> value;
  void *pvVar5;
  undefined4 in_register_00000034;
  Exception *pEVar6;
  undefined4 in_register_00000084;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1774:48)>
  *location_00;
  undefined1 local_a0 [16];
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  NetworkAddressImpl *local_80;
  Fault f;
  DatagramPort local_58;
  undefined *local_50;
  undefined *puStack_48;
  undefined8 local_40;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  local_80 = (NetworkAddressImpl *)CONCAT44(in_register_00000084,__flags);
  pEVar6 = (Exception *)CONCAT44(in_register_00000034,__fd);
  local_a0._8_8_ = this;
  pSVar4 = NetworkAddressImpl::chooseOneAddress(local_80);
  do {
    value = sendto((int)(pEVar6->ownFile).content.size_,__buf,__n,0,
                   (sockaddr *)&(pSVar4->addr).generic,pSVar4->addrlen);
    uVar2 = local_a0._8_8_;
    if (-1 < (long)value) {
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)local_a0._8_8_,value);
      return (ssize_t)(DatagramPortImpl *)uVar2;
    }
    osErrorNumber = kj::_::Debug::getOsErrorNumber(true);
  } while (osErrorNumber == -1);
  if (osErrorNumber == 0) {
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_a0);
    continuationTracePtr =
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1774:48)>
         ::anon_class_32_3_b2634f1b_for_func::operator();
    pp_Var1 = ((SleepHooks *)&((PromiseArenaMember *)local_a0._0_8_)->arena)->_vptr_SleepHooks;
    f.exception = pEVar6;
    if (pp_Var1 == (_func_int **)0x0 || (ulong)(local_a0._0_8_ - (long)pp_Var1) < 0x40) {
      pvVar5 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1774:48)>
                     *)((long)pvVar5 + 0x3c0);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<unsigned_char_const>,kj::NetworkAddress&)::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<unsigned_char_const>,kj::NetworkAddress&)::__1,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0,
                 (anon_class_32_3_b2634f1b_for_func *)&f,&continuationTracePtr);
      *(void **)((long)pvVar5 + 0x3c8) = pvVar5;
    }
    else {
      ((SleepHooks *)&((PromiseArenaMember *)local_a0._0_8_)->arena)->_vptr_SleepHooks =
           (_func_int **)0x0;
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:1774:48)>
                     *)(local_a0._0_8_ + -0x40);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<unsigned_char_const>,kj::NetworkAddress&)::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::DatagramPortImpl::send(kj::ArrayPtr<unsigned_char_const>,kj::NetworkAddress&)::__1,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0,
                 (anon_class_32_3_b2634f1b_for_func *)&f,&continuationTracePtr);
      ((unsigned_long *)(local_a0._0_8_ + -0x40))[1] = (unsigned_long)pp_Var1;
    }
    local_50 = &DAT_0042a172;
    puStack_48 = &DAT_0042a1d1;
    local_40 = 0x4c0000058b;
    location.function = &DAT_0042a1d1;
    location.fileName = &DAT_0042a172;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<unsigned_long>
              ((OwnPromiseNode *)&local_58,(Promise<unsigned_long> *)&intermediate,location);
    DVar3._vptr_DatagramPort = local_58._vptr_DatagramPort;
    local_58._vptr_DatagramPort = (_func_int **)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_58);
    uVar2 = local_a0._8_8_;
    ((DatagramPort *)local_a0._8_8_)->_vptr_DatagramPort = DVar3._vptr_DatagramPort;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_a0);
    return (ssize_t)(DatagramPortImpl *)uVar2;
  }
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x6eb,osErrorNumber,
             "n = sendto(fd, buffer.begin(), buffer.size(), 0, addr.getRaw(), addr.getRawSize())",""
            );
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Promise<size_t> DatagramPortImpl::send(
    ArrayPtr<const byte> buffer, NetworkAddress& destination) {
  auto& addr = downcast<NetworkAddressImpl>(destination).chooseOneAddress();

  ssize_t n;
  KJ_NONBLOCKING_SYSCALL(n = sendto(fd, buffer.begin(), buffer.size(), 0, addr.getRaw(), addr.getRawSize()));
  if (n < 0) {
    // Write buffer full.
    return observer.whenBecomesWritable().then([this, buffer, &destination]() {
      return send(buffer, destination);
    });
  } else {
    // If less than the whole message was sent, then it got truncated, and there's nothing we can
    // do about it.
    return n;
  }
}